

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O3

int __thiscall rapic::client::poll(client *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  connection_state cVar1;
  int iVar2;
  undefined8 in_RAX;
  runtime_error *this_00;
  pollfd fds;
  pollfd local_18;
  
  cVar1 = this->state_;
  if (cVar1 != disconnected) {
    local_18.revents = (short)((ulong)in_RAX >> 0x30);
    local_18.events =
         (ushort)(cVar1 == established) +
         (ushort)((this->wbuffer_)._M_string_length != 0 || cVar1 == in_progress) * 4 + 0x2000;
    local_18.fd = this->socket_;
    iVar2 = ::poll(&local_18,1,(int)__fds);
    return iVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"rapic: attempt to poll while disconnected");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto client::poll(int timeout) const -> void
{
  if (state_ == rapic::connection_state::disconnected)
    throw std::runtime_error{"rapic: attempt to poll while disconnected"};

  struct pollfd fds;
  fds.fd = socket_;
  fds.events = POLLRDHUP | (poll_read() ? POLLIN : 0) | (poll_write() ? POLLOUT : 0);
  ::poll(&fds, 1, timeout);
}